

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAbbreviationDeclaration.cpp
# Opt level: O1

Optional<llvm::DWARFFormValue> * __thiscall
llvm::DWARFAbbreviationDeclaration::getAttributeValue
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,DWARFAbbreviationDeclaration *this
          ,uint64_t DIEOffset,Attribute Attr,DWARFUnit *U)

{
  DataExtractor DebugInfoData_00;
  uint64_t uVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  Attribute *pAVar5;
  long lVar6;
  ulong uVar7;
  AttributeSpec *this_00;
  Optional<long> OVar8;
  undefined1 auStack_a0 [8];
  DWARFDataExtractor DebugInfoData;
  DWARFFormValue FormValue;
  uint64_t local_40;
  uint64_t Offset;
  
  uVar3 = (ulong)(this->AttributeSpecs).
                 super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                 super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                 .
                 super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                 .super_SmallVectorBase.Size;
  if (uVar3 == 0) {
    uVar7 = 0;
  }
  else {
    pAVar5 = (Attribute *)
             (this->AttributeSpecs).
             super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
             super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>.
             super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
             .super_SmallVectorBase.BeginX;
    uVar7 = 0;
    lVar6 = 0;
    do {
      if (*pAVar5 == Attr) {
        uVar7 = 0x100000000 - lVar6;
        break;
      }
      lVar6 = lVar6 + -1;
      pAVar5 = pAVar5 + 8;
    } while (-lVar6 != uVar3);
  }
  if ((uVar7 & 0x100000000) == 0) {
    (__return_storage_ptr__->Storage).field_0.empty = '\0';
    (__return_storage_ptr__->Storage).hasVal = false;
  }
  else {
    Offset = (uint64_t)__return_storage_ptr__;
    DWARFUnit::getDebugInfoExtractor((DWARFDataExtractor *)auStack_a0,U);
    local_40 = this->CodeByteSize + DIEOffset;
    uVar3 = (ulong)(this->AttributeSpecs).
                   super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                   super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                   .
                   super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                   .super_SmallVectorBase.Size;
    if (uVar3 != 0) {
      this_00 = (AttributeSpec *)
                (this->AttributeSpecs).
                super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                .
                super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                .super_SmallVectorBase.BeginX;
      lVar6 = uVar3 << 4;
      iVar4 = 0;
      do {
        uVar1 = Offset;
        if (iVar4 == (int)uVar7) {
          if (this_00->Form == DW_FORM_implicit_const) {
            if (this_00->Form != DW_FORM_implicit_const) {
              __assert_fail("isImplicitConst()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFAbbreviationDeclaration.h"
                            ,0x4a,
                            "int64_t llvm::DWARFAbbreviationDeclaration::AttributeSpec::getImplicitConstValue() const"
                           );
            }
            DWARFFormValue::createFromSValue(DW_FORM_implicit_const,(this_00->field_2).Value);
            *(undefined1 *)(uVar1 + 0x30) = 1;
            bVar2 = false;
          }
          else {
            DebugInfoData.Section._0_2_ = this_00->Form;
            bVar2 = DWARFFormValue::extractValue
                              ((DWARFFormValue *)&DebugInfoData.Section,
                               (DWARFDataExtractor *)auStack_a0,&local_40,(U->Header).FormParams,
                               (DWARFContext *)0x0,U);
            if (!bVar2) goto LAB_00ae1c7e;
            *(undefined8 *)(Offset + 0x20) = 0;
            *(undefined8 *)(Offset + 0x28) = 0;
            *(undefined8 *)(Offset + 0x10) = 0;
            *(uint8_t **)(Offset + 0x18) = FormValue.Value.data;
            *(ulong *)Offset = CONCAT62(DebugInfoData.Section._2_6_,(Form)DebugInfoData.Section);
            *(undefined8 *)(Offset + 8) = 0;
            *(undefined1 *)(Offset + 0x30) = 1;
            bVar2 = false;
          }
        }
        else {
LAB_00ae1c7e:
          OVar8 = AttributeSpec::getByteSize(this_00,U);
          if (((undefined1  [16])OVar8.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            DebugInfoData_00.Data.Length = (size_t)DebugInfoData.super_DataExtractor.Data.Data;
            DebugInfoData_00.Data.Data = (char *)auStack_a0;
            DebugInfoData_00.IsLittleEndian =
                 (undefined1)DebugInfoData.super_DataExtractor.Data.Length;
            DebugInfoData_00.AddressSize = DebugInfoData.super_DataExtractor.Data.Length._1_1_;
            DebugInfoData_00._18_6_ = DebugInfoData.super_DataExtractor.Data.Length._2_6_;
            DWARFFormValue::skipValue
                      (this_00->Form,DebugInfoData_00,&local_40,(U->Header).FormParams);
          }
          else {
            local_40 = local_40 + OVar8.Storage.field_0.value;
          }
          iVar4 = iVar4 + 1;
          bVar2 = true;
        }
        if (!bVar2) {
          return (Optional<llvm::DWARFFormValue> *)Offset;
        }
        this_00 = this_00 + 1;
        lVar6 = lVar6 + -0x10;
      } while (lVar6 != 0);
    }
    *(undefined1 *)Offset = 0;
    *(undefined1 *)(Offset + 0x30) = 0;
    __return_storage_ptr__ = (Optional<llvm::DWARFFormValue> *)Offset;
  }
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue> DWARFAbbreviationDeclaration::getAttributeValue(
    const uint64_t DIEOffset, const dwarf::Attribute Attr,
    const DWARFUnit &U) const {
  Optional<uint32_t> MatchAttrIndex = findAttributeIndex(Attr);
  if (!MatchAttrIndex)
    return None;

  auto DebugInfoData = U.getDebugInfoExtractor();

  // Add the byte size of ULEB that for the abbrev Code so we can start
  // skipping the attribute data.
  uint64_t Offset = DIEOffset + CodeByteSize;
  uint32_t AttrIndex = 0;
  for (const auto &Spec : AttributeSpecs) {
    if (*MatchAttrIndex == AttrIndex) {
      // We have arrived at the attribute to extract, extract if from Offset.
      if (Spec.isImplicitConst())
        return DWARFFormValue::createFromSValue(Spec.Form,
                                                Spec.getImplicitConstValue());

      DWARFFormValue FormValue(Spec.Form);
      if (FormValue.extractValue(DebugInfoData, &Offset, U.getFormParams(), &U))
        return FormValue;
    }
    // March Offset along until we get to the attribute we want.
    if (auto FixedSize = Spec.getByteSize(U))
      Offset += *FixedSize;
    else
      DWARFFormValue::skipValue(Spec.Form, DebugInfoData, &Offset,
                                U.getFormParams());
    ++AttrIndex;
  }
  return None;
}